

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_add_http_header_status(lws *wsi,uint _code,uchar **p,uchar *end)

{
  uchar *puVar1;
  uchar *puVar2;
  uint code_00;
  int iVar3;
  size_t sVar4;
  uchar local_98 [4];
  int n;
  uchar code_and_desc [60];
  char *local_50;
  char *p1;
  char *description;
  lws_protocol_vhost_options *plStack_38;
  uint code;
  lws_protocol_vhost_options *headers;
  uchar *end_local;
  uchar **p_local;
  uint _code_local;
  lws *wsi_local;
  
  code_00 = _code & 0xffff;
  p1 = "";
  if ((wsi->role_ops == &role_ops_h2) || ((wsi->wsistate & 0xf000000) == 0x1000000)) {
    iVar3 = lws_add_http2_header_status(wsi,code_00,p,end);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  else {
    if ((399 < code_00) && (code_00 < 0x1a2)) {
      p1 = err400[code_00 - 400];
    }
    if ((499 < code_00) && (code_00 < 0x1fa)) {
      p1 = err500[code_00 - 500];
    }
    if (code_00 == 100) {
      p1 = "Continue";
    }
    if (code_00 == 200) {
      p1 = "OK";
    }
    if (code_00 == 0x130) {
      p1 = "Not Modified";
    }
    else if ((299 < code_00) && (code_00 < 400)) {
      p1 = "Redirect";
    }
    if ((wsi->http).request_version < (HTTP_VERSION_2|HTTP_VERSION_1_1)) {
      local_50 = lws_add_http_header_status::hver[(wsi->http).request_version];
    }
    else {
      local_50 = "HTTP/1.0";
    }
    iVar3 = lws_snprintf((char *)local_98,0x3b,"%s %u %s",local_50,(ulong)code_00,p1);
    iVar3 = lws_add_http_header_by_name(wsi,(uchar *)0x0,local_98,iVar3,p,end);
    if (iVar3 != 0) {
      return 1;
    }
  }
  for (plStack_38 = wsi->vhost->headers; plStack_38 != (lws_protocol_vhost_options *)0x0;
      plStack_38 = plStack_38->next) {
    puVar1 = (uchar *)plStack_38->name;
    puVar2 = (uchar *)plStack_38->value;
    sVar4 = strlen(plStack_38->value);
    iVar3 = lws_add_http_header_by_name(wsi,puVar1,puVar2,(int)sVar4,p,end);
    if (iVar3 != 0) {
      return 1;
    }
  }
  if ((wsi->vhost->options & 0x10000000) != 0) {
    for (plStack_38 = pvo_hsbph + 4; plStack_38 != (lws_protocol_vhost_options *)0x0;
        plStack_38 = plStack_38->next) {
      puVar1 = (uchar *)plStack_38->name;
      puVar2 = (uchar *)plStack_38->value;
      sVar4 = strlen(plStack_38->value);
      iVar3 = lws_add_http_header_by_name(wsi,puVar1,puVar2,(int)sVar4,p,end);
      if (iVar3 != 0) {
        return 1;
      }
    }
  }
  if ((wsi->context->server_string != (char *)0x0) && ((_code & 0x40000000) == 0)) {
    if (wsi->context->server_string_len < 1) {
      __assert_fail("wsi->context->server_string_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/header.c"
                    ,0x164,
                    "int lws_add_http_header_status(struct lws *, unsigned int, unsigned char **, unsigned char *)"
                   );
    }
    iVar3 = lws_add_http_header_by_token
                      (wsi,WSI_TOKEN_HTTP_SERVER,(uchar *)wsi->context->server_string,
                       (int)wsi->context->server_string_len,p,end);
    if (iVar3 != 0) {
      return 1;
    }
  }
  if (((wsi->vhost->options & 0x8000) == 0) ||
     (iVar3 = lws_add_http_header_by_name
                        (wsi,(uchar *)"Strict-Transport-Security:",
                         (uchar *)"max-age=15768000 ; includeSubDomains",0x24,p,end), iVar3 == 0)) {
    if (*p < end + -2) {
      wsi_local._4_4_ = 0;
    }
    else {
      _lws_log(1,"%s: reached end of buffer\n","lws_add_http_header_status");
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_add_http_header_status(struct lws *wsi, unsigned int _code,
			   unsigned char **p, unsigned char *end)
{
	static const char * const hver[] = {
		"HTTP/1.0", "HTTP/1.1", "HTTP/2"
	};
	const struct lws_protocol_vhost_options *headers;
	unsigned int code = _code & LWSAHH_CODE_MASK;
	const char *description = "", *p1;
	unsigned char code_and_desc[60];
	int n;

#ifdef LWS_WITH_ACCESS_LOG
	wsi->http.access_log.response = code;
#endif

#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi)) {
		n = lws_add_http2_header_status(wsi, code, p, end);
		if (n)
			return n;
	} else
#endif
	{
		if (code >= 400 && code < (400 + LWS_ARRAY_SIZE(err400)))
			description = err400[code - 400];
		if (code >= 500 && code < (500 + LWS_ARRAY_SIZE(err500)))
			description = err500[code - 500];

		if (code == 100)
			description = "Continue";
		if (code == 200)
			description = "OK";
		if (code == 304)
			description = "Not Modified";
		else
			if (code >= 300 && code < 400)
				description = "Redirect";

		if (wsi->http.request_version < LWS_ARRAY_SIZE(hver))
			p1 = hver[wsi->http.request_version];
		else
			p1 = hver[0];

		n = lws_snprintf((char *)code_and_desc,
				 sizeof(code_and_desc) - 1, "%s %u %s",
				 p1, code, description);

		if (lws_add_http_header_by_name(wsi, NULL, code_and_desc, n, p,
						end))
			return 1;
	}

	headers = wsi->vhost->headers;
	while (headers) {
		if (lws_add_http_header_by_name(wsi,
				(const unsigned char *)headers->name,
				(unsigned char *)headers->value,
				(int)strlen(headers->value), p, end))
			return 1;

		headers = headers->next;
	}

	if (wsi->vhost->options &
	    LWS_SERVER_OPTION_HTTP_HEADERS_SECURITY_BEST_PRACTICES_ENFORCE) {
		headers = &pvo_hsbph[LWS_ARRAY_SIZE(pvo_hsbph) - 1];
		while (headers) {
			if (lws_add_http_header_by_name(wsi,
					(const unsigned char *)headers->name,
					(unsigned char *)headers->value,
					(int)strlen(headers->value), p, end))
				return 1;

			headers = headers->next;
		}
	}

	if (wsi->context->server_string &&
	    !(_code & LWSAHH_FLAG_NO_SERVER_NAME)) {
		assert(wsi->context->server_string_len > 0);
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_SERVER,
				(unsigned char *)wsi->context->server_string,
				wsi->context->server_string_len, p, end))
			return 1;
	}

	if (wsi->vhost->options & LWS_SERVER_OPTION_STS)
		if (lws_add_http_header_by_name(wsi, (unsigned char *)
				"Strict-Transport-Security:",
				(unsigned char *)"max-age=15768000 ; "
				"includeSubDomains", 36, p, end))
			return 1;

	if (*p >= (end - 2)) {
		lwsl_err("%s: reached end of buffer\n", __func__);

		return 1;
	}

	return 0;
}